

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O3

void Nwk_ManMarkTfoCone_rec(Nwk_Obj_t *pObj)

{
  long lVar1;
  
  if (((*(uint *)&pObj->field_0x20 & 0x10) == 0) &&
     (*(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10, 0 < pObj->nFanouts)) {
    lVar1 = 0;
    do {
      if (pObj->pFanio[pObj->nFanins + lVar1] == (Nwk_Obj_t *)0x0) {
        return;
      }
      Nwk_ManMarkTfoCone_rec(pObj->pFanio[pObj->nFanins + lVar1]);
      lVar1 = lVar1 + 1;
    } while ((int)lVar1 < pObj->nFanouts);
  }
  return;
}

Assistant:

void Nwk_ManMarkTfoCone_rec( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( pObj->MarkA )
        return;
    pObj->MarkA = 1;
    Nwk_ObjForEachFanout( pObj, pNext, i )
        Nwk_ManMarkTfoCone_rec( pNext );
}